

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O2

int main(void)

{
  _Bool _Var1;
  int iVar2;
  void *pvVar3;
  void *ptr;
  char *pcVar4;
  uint32_t *puVar5;
  undefined8 uStackY_80;
  undefined1 local_68 [8];
  slab_arena arena;
  quota quota;
  
  plan(2);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  plan(0x12);
  _space(_stdout);
  printf("# *** %s ***\n","slab_test_basic");
  arena.slab_size = 0;
  arena.flags = 0;
  slab_arena_create((slab_arena *)local_68,(quota *)&arena.slab_size,0,0,2);
  _ok((uint)(arena.arena == (void *)0x0),"arena.prealloc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xb9,
      "line %d",0xb9);
  _ok((uint)(arena.flags == 0),"quota_total(&quota) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xba,
      "line %d",0xba);
  _ok((uint)(arena.prealloc == 0),"arena.used == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xbb,
      "line %d",0xbb);
  _ok((uint)((int)arena.quota == 0x10000),"arena.slab_size == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xbc,
      "line %d",0xbc);
  slab_arena_destroy((slab_arena *)local_68);
  arena.slab_size = 0;
  arena.flags = 0x40;
  slab_arena_create((slab_arena *)local_68,(quota *)&arena.slab_size,1,1,2);
  _ok((uint)(arena.arena == (void *)0x10000),"arena.prealloc == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc3,
      "line %d",0xc3);
  _ok((uint)(arena.flags == 0x40),"quota_total(&quota) == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc4,
      "line %d",0xc4);
  _ok((uint)(arena.prealloc == 0),"arena.used == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc5,
      "line %d",0xc5);
  _ok((uint)((int)arena.quota == 0x10000),"arena.slab_size == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc6,
      "line %d",0xc6);
  pvVar3 = slab_map((slab_arena *)local_68);
  _ok((uint)(pvVar3 != (void *)0x0),"ptr != NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",200,
      "line %d",200);
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xc9,
      "line %d",0xc9);
  ptr = slab_map((slab_arena *)local_68);
  _ok((uint)(ptr == (void *)0x0),"ptr1 == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xcb,
      "line %d",0xcb);
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xcc,
      "line %d",0xcc);
  slab_unmap((slab_arena *)local_68,pvVar3);
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xce,
      "line %d",0xce);
  slab_unmap((slab_arena *)local_68,ptr);
  _ok((uint)(arena.prealloc == 0x10000),"arena.used == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd0,
      "line %d",0xd0);
  slab_arena_destroy((slab_arena *)local_68);
  arena.slab_size = 0;
  arena.flags = 0x7a2;
  slab_arena_create((slab_arena *)local_68,(quota *)&arena.slab_size,3000000,1,2);
  _ok((uint)(arena.arena == (void *)0x1f0000),"arena.prealloc == 2031616",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd6,
      "line %d",0xd6);
  _ok((uint)(arena.flags == 0x7a2),"quota_total(&quota) == 2000896",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd7,
      "line %d",0xd7);
  _ok((uint)(arena.prealloc == 0),"arena.used == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd8,
      "line %d",0xd8);
  _ok((uint)((int)arena.quota == 0x10000),"arena.slab_size == SLAB_MIN_SIZE",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0xd9,
      "line %d",0xd9);
  slab_arena_destroy((slab_arena *)local_68);
  _space(_stdout);
  printf("# *** %s: done ***\n","slab_test_basic");
  check_plan();
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n");
  iVar2 = access("/proc/self/smaps",0);
  if (iVar2 != 0) {
LAB_001017d9:
    _ok(1,"true",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",0x7b
        ,"line %d",0x7b);
    _space(_stdout);
    printf("# *** %s: done ***\n","slab_test_madvise");
    check_plan();
    _space(_stdout);
    printf("# *** %s: done ***\n","main");
    iVar2 = check_plan();
    return iVar2;
  }
  puVar5 = &arena.slab_size;
  arena.slab_size = 0;
  arena.flags = 0x7a2;
  slab_arena_create((slab_arena *)local_68,(quota *)puVar5,3000000,1,-0x7ffffffb);
  pvVar3 = slab_map((slab_arena *)local_68);
  if (pvVar3 == (void *)0x0) {
    pcVar4 = "ptr != NULL";
    uStackY_80 = 100;
  }
  else {
    _Var1 = vma_has_flag((unsigned_long)pvVar3,(char *)puVar5);
    if (_Var1) {
      slab_unmap((slab_arena *)local_68,pvVar3);
      slab_arena_destroy((slab_arena *)local_68);
      puVar5 = &arena.slab_size;
      arena.slab_size = 0;
      arena.flags = 0x7a2;
      slab_arena_create((slab_arena *)local_68,(quota *)puVar5,0,0x10000,-0x7ffffffb);
      pvVar3 = slab_map((slab_arena *)local_68);
      if (pvVar3 == (void *)0x0) {
        pcVar4 = "ptr != NULL";
        uStackY_80 = 0x75;
      }
      else {
        _Var1 = vma_has_flag((unsigned_long)pvVar3,(char *)puVar5);
        if (_Var1) {
          slab_unmap((slab_arena *)local_68,pvVar3);
          slab_arena_destroy((slab_arena *)local_68);
          goto LAB_001017d9;
        }
        pcVar4 = "vma_has_flag((unsigned long)ptr, \"dd\")";
        uStackY_80 = 0x76;
      }
    }
    else {
      pcVar4 = "vma_has_flag((unsigned long)ptr, \"dd\")";
      uStackY_80 = 0x65;
    }
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar4,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",
          uStackY_80,"slab_test_madvise");
  exit(-1);
}

Assistant:

int
main(void)
{
	plan(2);
	header();

	slab_test_basic();
#ifdef ENABLE_ASAN
	slab_test_membership();
#else
	slab_test_madvise();
#endif

	footer();
	return check_plan();
}